

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.cpp
# Opt level: O0

bool EncodeSize(size_t size,uchar *out,size_t cbOut,size_t *cbUsed)

{
  size_t offset;
  byte local_38;
  uchar auStack_37 [3];
  uint i;
  uchar tmp [8];
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *out_local;
  size_t size_local;
  
  tmp = (uchar  [8])cbUsed;
  memset(&local_38,0,8);
  offset._4_4_ = 0;
  out_local = (uchar *)size;
  if ((size < 0x80) && (cbOut != 0)) {
    *out = (uchar)size;
    *(undefined8 *)tmp = 1;
    size_local._7_1_ = true;
  }
  else {
    for (; offset._4_4_ < 7; offset._4_4_ = offset._4_4_ + 1) {
      tmp[-(ulong)(offset._4_4_ + 1)] = (uchar)out_local;
      out_local = (uchar *)((ulong)out_local >> 8);
      if (out_local == (uchar *)0x0) {
        *(ulong *)tmp = (ulong)(offset._4_4_ + 1);
        tmp[-(ulong)(offset._4_4_ + 1) + -1] = (byte)*(undefined8 *)tmp | 0x80;
        *(long *)tmp = *(long *)tmp + 1;
        break;
      }
    }
    if (out_local == (uchar *)0x0) {
      if (cbOut < *(ulong *)tmp) {
        size_local._7_1_ = false;
      }
      else {
        memcpy_s(out,cbOut,tmp + -*(long *)tmp,*(size_t *)tmp);
        size_local._7_1_ = true;
      }
    }
    else {
      size_local._7_1_ = false;
    }
  }
  return size_local._7_1_;
}

Assistant:

bool EncodeSize(size_t size, unsigned char * out, size_t cbOut, size_t & cbUsed)
{
	unsigned char tmp[sizeof(unsigned long long)] = { 0 };
	unsigned int i = 0;

	if (size <= 0x7f && cbOut >= 1)
	{
		*out = static_cast<unsigned char>(size);
		cbUsed = 1;
		return true;
	}

	// Else the first byte is the number of following big-endian
	// non-zero bytes
	for (; i < sizeof(unsigned long long) - 1; ++i)
	{
		// Convert incoming size to big-endian order
		size_t offset = sizeof(unsigned long long) - (i + 1);
		tmp[offset] = static_cast<unsigned char>(size);
		size >>= 8;

		if (size == 0)
		{
			cbUsed = i + 1;
			tmp[offset - 1] = static_cast<unsigned char>(0x80 | (cbUsed));
			cbUsed++;
			break;
		}
	}

	// Detect abnormal loop exit
	if (size != 0)
		return false;

	if (cbOut >= cbUsed)
	{
		memcpy_s(out, cbOut, tmp + sizeof(long long) - cbUsed, cbUsed);
		return true;
	}
	
	return false;
}